

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::Table<unsigned_int,_kj::TreeIndex<kj::_::(anonymous_namespace)::UintCompare>_>::Impl<0UL,_false>
::insert(Impl<0UL,_false> *this,
        Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *table,
        size_t pos,StringPtr *row,uint skip)

{
  uint uVar1;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  ulong uVar3;
  Maybe<unsigned_long> MVar4;
  undefined1 local_94 [4];
  size_t pos_local;
  Iterator iter;
  StringPtr *local_70;
  long local_68;
  undefined **local_60;
  anon_union_40_1_a8c68091_for_NullableValue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>_2
  local_58;
  
  if (skip == 0) {
    *this = (Impl<0UL,_false>)0x0;
  }
  else {
    local_70 = (table->rows).builder.ptr;
    local_68 = (long)(table->rows).builder.pos - (long)local_70 >> 2;
    local_94 = *(undefined1 (*) [4])&(row->content).ptr;
    local_58.value.table =
         (Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *)
         local_94;
    local_58.value.indexObj = (HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)&local_70;
    local_60 = &PTR_search_0021bb90;
    pos_local = pos;
    local_58.value.success = (bool *)&table->indexes;
    _::BTreeImpl::insert(&iter,(BTreeImpl *)&(table->indexes).erasedCount,(SearchKey *)&local_60);
    aVar2.value._4_4_ = 0;
    aVar2.value._0_4_ = iter.row;
    if (aVar2.value == 0xe) {
      aVar2.value = 0xe;
    }
    else {
      uVar1 = (iter.leaf)->rows[aVar2.value].i;
      if ((uVar1 != 0) &&
         (uVar3 = (ulong)(uVar1 - 1),
         (undefined1  [4])*(int *)((long)&(local_70->content).ptr + uVar3 * 4) == local_94)) {
        *this = (Impl<0UL,_false>)0x1;
        *(ulong *)(this + 8) = uVar3;
        pos = (size_t)aVar2;
        goto LAB_0015c95f;
      }
    }
    memmove((iter.leaf)->rows + aVar2.value + 1,(iter.leaf)->rows + aVar2.value,
            (ulong)(iter.row + 1) * -4 + 0x38);
    (iter.leaf)->rows[aVar2.value].i = (int)pos + 1;
    local_60 = (undefined **)CONCAT71(local_60._1_7_,1);
    local_58.value.success = (bool *)&iter;
    local_58.value.pos = &pos_local;
    *this = (Impl<0UL,_false>)0x0;
    iter.tree._0_1_ = 1;
    local_58.value.indexObj = &table->indexes;
    local_58.value.table = table;
    local_58.value.row = row;
    _::
    Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:450:5)>
    ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:450:5)>
                 *)&local_60);
    pos = (size_t)extraout_RDX;
  }
LAB_0015c95f:
  MVar4.ptr.field_1.value = pos;
  MVar4.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar4.ptr;
}

Assistant:

static kj::Maybe<size_t> insert(Table<Row, Indexes...>& table, size_t pos, Row& row, uint skip) {
    if (skip == index) {
      return Impl<index + 1>::insert(table, pos, row, skip);
    }
    auto& indexObj = get<index>(table.indexes);
    KJ_IF_SOME(existing, indexObj.insert(table.rows.asPtr(), pos, indexObj.keyForRow(row))) {
      return existing;
    }

    bool success = false;
    KJ_DEFER(if (!success) {
      indexObj.erase(table.rows.asPtr(), pos, indexObj.keyForRow(row));
    });
    auto result = Impl<index + 1>::insert(table, pos, row, skip);
    success = result == kj::none;
    return result;
  }